

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::Invert(S2Polygon *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  S2Loop *pSVar4;
  S2Loop *pSVar5;
  reference pvVar6;
  size_type sVar7;
  ostream *poVar8;
  S2LogMessage local_98;
  S2LogMessageVoidify local_85;
  int local_84;
  int local_80;
  int i_2;
  int i_1;
  int last_best;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  new_loops;
  double angle;
  pointer puStack_50;
  int i;
  double best_angle;
  double kNone;
  int best;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_30;
  value_type local_18;
  S2Polygon *local_10;
  S2Polygon *this_local;
  
  local_10 = this;
  bVar1 = is_empty(this);
  if (bVar1) {
    S2Loop::kFull();
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_18,&local_30);
    std::
    vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ::push_back(&this->loops_,&local_18);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&local_18);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector(&local_30);
  }
  else {
    bVar1 = is_full(this);
    if (bVar1) {
      ClearLoops(this);
    }
    else {
      kNone._0_4_ = 0;
      puStack_50 = (pointer)0x4024000000000000;
      for (angle._4_4_ = 1; iVar2 = num_loops(this), angle._4_4_ < iVar2;
          angle._4_4_ = angle._4_4_ + 1) {
        pSVar4 = loop(this,angle._4_4_);
        iVar2 = S2Loop::depth(pSVar4);
        if (iVar2 == 0) {
          if (((double)puStack_50 == 10.0) && (!NAN((double)puStack_50))) {
            pSVar4 = loop(this,kNone._0_4_);
            puStack_50 = (pointer)S2Loop::GetCurvature(pSVar4);
          }
          pSVar4 = loop(this,angle._4_4_);
          new_loops.
          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)S2Loop::GetCurvature(pSVar4)
          ;
          if ((double)new_loops.
                      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage < (double)puStack_50) {
LAB_004b8c4a:
            kNone._0_4_ = angle._4_4_;
            puStack_50 = new_loops.
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else if (((double)new_loops.
                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage == (double)puStack_50
                   ) && (!NAN((double)new_loops.
                                      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
                         !NAN((double)puStack_50))) {
            pSVar4 = loop(this,angle._4_4_);
            pSVar5 = loop(this,kNone._0_4_);
            iVar2 = CompareLoops(pSVar4,pSVar5);
            if (iVar2 < 0) goto LAB_004b8c4a;
          }
        }
      }
      pSVar4 = loop(this,kNone._0_4_);
      S2Loop::Invert(pSVar4);
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                *)&i_1);
      iVar2 = num_loops(this);
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::reserve((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 *)&i_1,(long)iVar2);
      i_2 = GetLastDescendant(this,kNone._0_4_);
      pvVar6 = std::
               vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ::operator[](&this->loops_,(long)kNone._0_4_);
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::push_back((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   *)&i_1,pvVar6);
      for (local_80 = 0; iVar2 = local_80, iVar3 = num_loops(this), iVar2 < iVar3;
          local_80 = local_80 + 1) {
        if ((local_80 < kNone._0_4_) || (i_2 < local_80)) {
          pSVar4 = loop(this,local_80);
          pSVar5 = loop(this,local_80);
          iVar2 = S2Loop::depth(pSVar5);
          S2Loop::set_depth(pSVar4,iVar2 + 1);
          pvVar6 = std::
                   vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ::operator[](&this->loops_,(long)local_80);
          std::
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          ::push_back((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       *)&i_1,pvVar6);
        }
      }
      for (local_84 = 0; iVar2 = local_84, iVar3 = num_loops(this), iVar2 < iVar3;
          local_84 = local_84 + 1) {
        if ((kNone._0_4_ < local_84) && (local_84 <= i_2)) {
          pSVar4 = loop(this,local_84);
          pSVar5 = loop(this,local_84);
          iVar2 = S2Loop::depth(pSVar5);
          S2Loop::set_depth(pSVar4,iVar2 + -1);
          pvVar6 = std::
                   vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ::operator[](&this->loops_,(long)local_84);
          std::
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          ::push_back((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       *)&i_1,pvVar6);
        }
      }
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::swap(&this->loops_,
             (vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
              *)&i_1);
      sVar7 = std::
              vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
              ::size((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                      *)&i_1);
      iVar2 = num_loops(this);
      if (sVar7 != (long)iVar2) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_98,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x357,kFatal,(ostream *)&std::cerr);
        poVar8 = S2LogMessage::stream(&local_98);
        poVar8 = std::operator<<(poVar8,"Check failed: (new_loops.size()) == (num_loops()) ");
        S2LogMessageVoidify::operator&(&local_85,poVar8);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_98);
      }
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::~vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 *)&i_1);
    }
  }
  ClearIndex(this);
  InitLoopProperties(this);
  return;
}

Assistant:

void S2Polygon::Invert() {
  // Inverting any one loop will invert the polygon.  The best loop to invert
  // is the one whose area is largest, since this yields the smallest area
  // after inversion.  The loop with the largest area is always at depth 0.
  // The descendents of this loop all have their depth reduced by 1, while the
  // former siblings of this loop all have their depth increased by 1.

  // The empty and full polygons are handled specially.
  if (is_empty()) {
    loops_.push_back(make_unique<S2Loop>(S2Loop::kFull()));
  } else if (is_full()) {
    ClearLoops();
  } else {
    // Find the loop whose area is largest (i.e., whose curvature is
    // smallest), minimizing calls to GetCurvature().  In particular, for
    // polygons with a single shell at level 0 there is not need to call
    // GetCurvature() at all.  (This method is relatively expensive.)
    int best = 0;
    const double kNone = 10.0;  // Flag that means "not computed yet"
    double best_angle = kNone;
    for (int i = 1; i < num_loops(); ++i) {
      if (loop(i)->depth() == 0) {
        // We defer computing the curvature of loop 0 until we discover
        // that the polygon has another top-level shell.
        if (best_angle == kNone) best_angle = loop(best)->GetCurvature();
        double angle = loop(i)->GetCurvature();
        // We break ties deterministically in order to avoid having the output
        // depend on the input order of the loops.
        if (angle < best_angle ||
            (angle == best_angle && CompareLoops(loop(i), loop(best)) < 0)) {
          best = i;
          best_angle = angle;
        }
      }
    }
    // Build the new loops vector, starting with the inverted loop.
    loop(best)->Invert();
    vector<unique_ptr<S2Loop>> new_loops;
    new_loops.reserve(num_loops());
    // Add the former siblings of this loop as descendants.
    int last_best = GetLastDescendant(best);
    new_loops.push_back(std::move(loops_[best]));
    for (int i = 0; i < num_loops(); ++i) {
      if (i < best || i > last_best) {
        loop(i)->set_depth(loop(i)->depth() + 1);
        new_loops.push_back(std::move(loops_[i]));
      }
    }
    // Add the former children of this loop as siblings.
    for (int i = 0; i < num_loops(); ++i) {
      if (i > best && i <= last_best) {
        loop(i)->set_depth(loop(i)->depth() - 1);
        new_loops.push_back(std::move(loops_[i]));
      }
    }
    loops_.swap(new_loops);
    S2_DCHECK_EQ(new_loops.size(), num_loops());
  }
  ClearIndex();
  InitLoopProperties();
}